

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void long_filename_test(void)

{
  size_t sVar1;
  void *rvalue;
  char value [256];
  char key [256];
  size_t rvalue_len;
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char temp [4096];
  char cmd [4096];
  char filename [4096];
  char keyword [63];
  int m;
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_ffffffffffffcad8;
  fdb_file_handle *in_stack_ffffffffffffcae0;
  size_t *in_stack_ffffffffffffcaf8;
  void **in_stack_ffffffffffffcb00;
  char *in_stack_ffffffffffffcb08;
  void *in_stack_ffffffffffffcb10;
  fdb_kvs_handle *in_stack_ffffffffffffcb18;
  undefined1 local_34d8 [256];
  char local_33d8 [208];
  fdb_config *in_stack_ffffffffffffccf8;
  char *in_stack_ffffffffffffcd00;
  fdb_file_handle **in_stack_ffffffffffffcd08;
  size_t local_32d8 [33];
  fdb_status local_31cc;
  undefined1 local_31b0 [264];
  char local_30a8 [4096];
  char local_20a8 [4096];
  char local_10a8 [4096];
  char local_a8 [68];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 0xf;
  local_64 = 1000;
  memcpy(local_a8,"abcdefghijklmnopqrstuvwxyz0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ",0x3f);
  fdb_get_default_config();
  memcpy(local_31b0,local_34d8,0xf8);
  fdb_get_default_kvs_config();
  sprintf(local_30a8,"/%s",local_a8);
  sprintf(local_10a8,"%s",local_a8);
  while (sVar1 = strlen(local_10a8), sVar1 < 0x400) {
    strcat(local_10a8,local_a8);
  }
  local_31cc = fdb_open(in_stack_ffffffffffffcd08,in_stack_ffffffffffffcd00,
                        in_stack_ffffffffffffccf8);
  if (local_31cc != FDB_RESULT_TOO_LONG_FILENAME) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,900);
    long_filename_test::__test_pass = 0;
    if (local_31cc != FDB_RESULT_TOO_LONG_FILENAME) {
      __assert_fail("s == FDB_RESULT_TOO_LONG_FILENAME",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,900,"void long_filename_test()");
    }
  }
  sprintf(local_20a8,"rm -rf  %s",local_a8);
  local_5c = system(local_20a8);
  for (local_54 = 0; (int)local_54 < local_60; local_54 = local_54 + 1) {
    sprintf(local_20a8,"mkdir  %s",local_a8);
    for (local_58 = 0; local_58 < (int)local_54; local_58 = local_58 + 1) {
      strcat(local_20a8,local_30a8);
    }
    sVar1 = strlen(local_20a8);
    if (0x400 < sVar1) break;
    local_5c = system(local_20a8);
  }
  sprintf(local_10a8,"%s",local_a8);
  for (local_58 = 0; local_58 < (int)(local_54 + -1); local_58 = local_58 + 1) {
    strcat(local_10a8,local_30a8);
  }
  strcat(local_10a8,"/dbfile");
  local_31cc = fdb_open(in_stack_ffffffffffffcd08,in_stack_ffffffffffffcd00,
                        in_stack_ffffffffffffccf8);
  if (local_31cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x39c);
    long_filename_test::__test_pass = 0;
    if (local_31cc != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x39c,"void long_filename_test()");
    }
  }
  local_31cc = fdb_kvs_open_default
                         (in_stack_ffffffffffffcae0,(fdb_kvs_handle **)in_stack_ffffffffffffcad8,
                          (fdb_kvs_config *)0x10aeb2);
  if (local_31cc != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x39e);
    long_filename_test::__test_pass = 0;
    if (local_31cc != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x39e,"void long_filename_test()");
    }
  }
  local_54 = 0;
  do {
    if (local_64 <= (int)local_54) {
      local_31cc = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffcad8,'\0');
      if (local_31cc != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x3a8);
        long_filename_test::__test_pass = 0;
        if (local_31cc != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x3a8,"void long_filename_test()");
        }
      }
      local_54 = 0;
      do {
        if (local_64 <= (int)local_54) {
          local_31cc = fdb_kvs_close(in_stack_ffffffffffffcad8);
          if (local_31cc != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x3b3);
            long_filename_test::__test_pass = 0;
            if (local_31cc != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x3b3,"void long_filename_test()");
            }
          }
          local_31cc = fdb_close((fdb_file_handle *)in_stack_ffffffffffffcad8);
          if (local_31cc != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x3b5);
            long_filename_test::__test_pass = 0;
            if (local_31cc != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x3b5,"void long_filename_test()");
            }
          }
          local_31cc = fdb_shutdown();
          if (local_31cc != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x3b7);
            long_filename_test::__test_pass = 0;
            if (local_31cc != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x3b7,"void long_filename_test()");
            }
          }
          sprintf(local_20a8,"rm -rf  %s",local_a8);
          local_5c = system(local_20a8);
          memleak_end();
          if (long_filename_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","long filename test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","long filename test");
          }
          return;
        }
        sprintf((char *)local_32d8,"key%08d",(ulong)local_54);
        strlen((char *)local_32d8);
        local_31cc = fdb_get_kv(in_stack_ffffffffffffcb18,in_stack_ffffffffffffcb10,
                                (size_t)in_stack_ffffffffffffcb08,in_stack_ffffffffffffcb00,
                                in_stack_ffffffffffffcaf8);
        if (local_31cc != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x3ae);
          long_filename_test::__test_pass = 0;
          if (local_31cc != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x3ae,"void long_filename_test()");
          }
        }
        fdb_free_block((void *)0x10b1e2);
        local_54 = local_54 + 1;
      } while( true );
    }
    sprintf((char *)local_32d8,"key%08d",(ulong)local_54);
    sprintf(local_33d8,"value%08d",(ulong)local_54);
    in_stack_ffffffffffffcaf8 = local_32d8;
    sVar1 = strlen((char *)local_32d8);
    in_stack_ffffffffffffcb00 = (void **)(sVar1 + 1);
    in_stack_ffffffffffffcb08 = local_33d8;
    strlen(local_33d8);
    local_31cc = fdb_set_kv(in_stack_ffffffffffffcb18,in_stack_ffffffffffffcb10,
                            (size_t)in_stack_ffffffffffffcb08,in_stack_ffffffffffffcb00,
                            (size_t)in_stack_ffffffffffffcaf8);
    if (local_31cc != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x3a5);
      long_filename_test::__test_pass = 0;
      if (local_31cc != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x3a5,"void long_filename_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void long_filename_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n=15, m=1000;
    char keyword[] = "abcdefghijklmnopqrstuvwxyz0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    char filename[4096], cmd[4096], temp[4096];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    size_t rvalue_len;
    char key[256], value[256];
    void *rvalue;

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    sprintf(temp, SHELL_DMT"%s", keyword);

    // filename longer than 1024 bytes
    sprintf(filename, "%s", keyword);
    while (strlen(filename) < 1024) {
        strcat(filename, keyword);
    }
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_TOO_LONG_FILENAME);

    // make nested directories for long path
    // but shorter than 1024 bytes (windows: 256 bytes)
    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;
    for (i=0;i<n;++i) {
        sprintf(cmd, SHELL_MKDIR" %s", keyword);
        for (j=0;j<i;++j){
            strcat(cmd, temp);
        }
        if (strlen(cmd) > SHELL_MAX_PATHLEN) break;
        r = system(cmd);
        (void)r;
    }

    // create DB file
    sprintf(filename, "%s", keyword);
    for (j=0;j<i-1;++j){
        strcat(filename, temp);
    }
    strcat(filename, SHELL_DMT"dbfile");
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        sprintf(value, "value%08d", i);
        s = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === read ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        s = fdb_get_kv(db, key, strlen(key)+1, &rvalue, &rvalue_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_free_block(rvalue);
    }

    s = fdb_kvs_close(db);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;

    memleak_end();
    TEST_RESULT("long filename test");
}